

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::FeatureVectorizer_InputColumn
          (FeatureVectorizer_InputColumn *this,FeatureVectorizer_InputColumn *from)

{
  void *pvVar1;
  string *initial_value;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__FeatureVectorizer_InputColumn_00409d20;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->inputcolumn_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  initial_value = (from->inputcolumn_).ptr_;
  if ((initial_value != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
      ) && (initial_value->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->inputcolumn_,initial_value);
  }
  this->inputdimensions_ = from->inputdimensions_;
  return;
}

Assistant:

FeatureVectorizer_InputColumn::FeatureVectorizer_InputColumn(const FeatureVectorizer_InputColumn& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  inputcolumn_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.inputcolumn().size() > 0) {
    inputcolumn_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.inputcolumn_);
  }
  inputdimensions_ = from.inputdimensions_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.FeatureVectorizer.InputColumn)
}